

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O0

void functionPrototype(void)

{
  object *poVar1;
  typeDesc *ptVar2;
  char local_a8 [8];
  char procid [100];
  int protoTypeDeclared;
  int parBlkSize;
  int lclBlkSize;
  int markSize;
  typeDesc *varType;
  typeDesc *retType;
  object *proc;
  object *typeObj;
  object *obj;
  
  procid[0x60] = '\x01';
  procid[0x61] = '\0';
  procid[0x62] = '\0';
  procid[99] = '\0';
  if (currentSymbol == 0x25f) {
    varType = getType(intTypeIndex);
    getSymbol();
  }
  else if (currentSymbol == 0x264) {
    ptVar2 = getType(fileTypeIndex);
    varType = getType(ptVar2->refIndex);
    getSymbol();
  }
  else if (currentSymbol == 0x261) {
    varType = getType(charTypeIndex);
    getSymbol();
  }
  else if (currentSymbol == 0x26d) {
    varType = getType(boolTypeIndex);
    getSymbol();
  }
  else if (currentSymbol == 0x25e) {
    getSymbol();
    varType = getType(voidTypeIndex);
  }
  else {
    if (currentSymbol != 0x268) {
      mark("unkown return value");
      exit(-1);
    }
    getSymbol();
    if (currentSymbol != 0x1f5) {
      mark("missing identifier in prototype");
      exit(-1);
    }
    poVar1 = find();
    ptVar2 = getType(poVar1->typeIndex);
    varType = getType(ptVar2->refIndex);
    getSymbol();
    if (currentSymbol != 99) {
      mark("malformed return value in prototype");
      exit(-1);
    }
    getSymbol();
  }
  if (currentSymbol != 0x1f5) {
    mark("missing identifier in procedure prototype");
    exit(-1);
  }
  getSymbol();
  poVar1 = findProc();
  if (poVar1 == guard) {
    stringCopy(idName,local_a8);
    poVar1 = newObj(0x2c0);
    poVar1->hasPrototype = 1;
    poVar1->retTypeIndex = varType->index;
    incLevel(1);
    openScope();
    poVar1->val = -1;
    if (currentSymbol != 0x12d) {
      mark("no valid argument definitions");
      exit(-1);
    }
    getSymbol();
    protoTypeDeclared = arguments(1,poVar1,8);
    for (typeObj = topScope->next; typeObj != guard; typeObj = typeObj->next) {
      typeObj->lev = currentLevel;
      ptVar2 = getType(typeObj->typeIndex);
      protoTypeDeclared = protoTypeDeclared - ptVar2->size;
      typeObj->val = protoTypeDeclared;
    }
    poVar1->dsc = topScope;
    if (currentSymbol != 0x12e) {
      mark("missing right paranthesis in procedure declaration/prototype");
      exit(-1);
    }
    getSymbol();
    if (currentSymbol != 0xcb) {
      mark("prototype already declared");
      exit(-1);
    }
    closeScope();
    incLevel(-1);
    getSymbol();
    return;
  }
  mark("multiple prototypes not allowed");
  exit(-1);
}

Assistant:

procedure 
void functionPrototype(void) {
	variable struct object *obj; variable struct object *typeObj; variable struct object *proc;
	variable struct typeDesc *retType; variable struct typeDesc *varType;
	variable int markSize; variable int lclBlkSize;	variable int parBlkSize; variable int protoTypeDeclared;
	variable char procid[100];
	obj = NULL;	proc = NULL; retType = NULL; varType = NULL; typeObj = NULL;
	markSize = 8; lclBlkSize = 0; parBlkSize = 0; protoTypeDeclared = 1;

	if (currentSymbol == SYMBOL_INT) {
		retType = getType(intTypeIndex);
		getSymbol();	
	} elsif (currentSymbol == SYMBOL_FD) {
		retType = getType(fileTypeIndex);
		retType = getType(retType->refIndex);
		getSymbol();
	} elsif (currentSymbol == SYMBOL_CHAR) {
		retType = getType(charTypeIndex);
		getSymbol();
	} elsif (currentSymbol == SYMBOL_BOOL) {
		retType = getType(boolTypeIndex);
		getSymbol();
	} elsif (currentSymbol == SYMBOL_VOID) {
		getSymbol();
		retType = getType(voidTypeIndex);
	} elsif (currentSymbol == SYMBOL_STRUCT) { 
		getSymbol();
		if (currentSymbol == SYMBOL_IDENTIFIER) {
			typeObj = find();
			retType = getType(typeObj->typeIndex);
			retType = getType(retType->refIndex);
			getSymbol();
			if (currentSymbol == SYMBOL_MUL) {
				getSymbol(); 
			} else {
				mark("malformed return value in prototype");
				exit(-1);
			}
		} else {
			mark("missing identifier in prototype");
			exit(-1);
		}
	} else {
		mark("unkown return value");
		exit(-1);
	}
	if (currentSymbol == SYMBOL_IDENTIFIER) {
		getSymbol();
		proc = findProc();
		if (proc != guard) {
			mark("multiple prototypes not allowed");
			exit(-1);
		} else {
			stringCopy(idName,procid);
			proc = newObj(CLASS_PROC);
			proc->hasPrototype = true;
			proc->retTypeIndex = retType->index;
			parBlkSize = markSize;
			incLevel(1);
			openScope();
			proc->val = -1;
		}
	} else {
		mark("missing identifier in procedure prototype");
		exit(-1);
	}
	if (currentSymbol == SYMBOL_LPARAN) {
		getSymbol();
		parBlkSize = arguments(1,proc,parBlkSize);
		lclBlkSize = parBlkSize;
		obj = topScope->next;
		while (obj != guard) {
			obj->lev = currentLevel;
			varType = getType(obj->typeIndex);
			lclBlkSize = lclBlkSize - varType->size;
			obj->val = lclBlkSize;
			obj = obj->next;
		}
		proc->dsc = topScope; /* keep possibiliy for setting topScope correctly in functionBlock */
		if (currentSymbol == SYMBOL_RPARAN) {
			getSymbol();
		} 
		else {
			mark("missing right paranthesis in procedure declaration/prototype");
			exit(-1);
		}
	} else {
		mark("no valid argument definitions");
		exit(-1);
	}
	if (currentSymbol == SYMBOL_SEMICOLON)  { 
		closeScope(); incLevel(-1);
		getSymbol();
	} else {
		mark("prototype already declared");
		exit(-1);
	}
}